

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCVWarp.cpp
# Opt level: O0

void writeIni(string *iniwpath)

{
  ostream *poVar1;
  int anon_var_0;
  ostream local_210 [8];
  ofstream inifileout;
  string *iniwpath_local;
  
  std::ofstream::ofstream(local_210,iniwpath,0x10);
  poVar1 = std::operator<<(local_210,"#ini_file_for_OCVWarp--Comments_start_with_#");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#Enter_each_parameter_in_the_line_below_the_comment. ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#AngleXinDegrees_float");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,anglexstr);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#AngleXIncrementperFrameinDegrees_float");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,anglexincrstr);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#AngleYinDegrees_float");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,angleystr);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#AngleYIncrementperFrameinDegrees_float");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,angleyincrstr);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#Output_width_pixels");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(local_210,outputw);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#Output_height_pixels");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(local_210,outputh);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#0=360Fisheye_1=180Fisheye_etc--see_transformtype.txt");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(local_210,transformtype);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,
                           "#Output_video_codec_fourcc__use_NULL_for_same_as_input--see_fourcc.txt")
  ;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,outputfourccstr);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#Path_to_Map_file_used_for_transformtype_4_&_5");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"EP_xyuv_1920.map");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,"#Output_fps_-1=same_as_input__0=image_sequence");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_210,outputfpsstr);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

inline void writeIni(std::string iniwpath) 
{
	try {
		std::ofstream inifileout(iniwpath);
		inifileout << "#ini_file_for_OCVWarp--Comments_start_with_#" << std::endl;
		inifileout << "#Enter_each_parameter_in_the_line_below_the_comment. " << std::endl;
		inifileout << "#AngleXinDegrees_float" << std::endl;
		inifileout << anglexstr << std::endl;
		inifileout << "#AngleXIncrementperFrameinDegrees_float" << std::endl;
		inifileout << anglexincrstr << std::endl;
		inifileout << "#AngleYinDegrees_float" << std::endl;
		inifileout << angleystr << std::endl;
		inifileout << "#AngleYIncrementperFrameinDegrees_float" << std::endl;
		inifileout << angleyincrstr << std::endl;
		inifileout << "#Output_width_pixels" << std::endl;
		inifileout << outputw << std::endl;
		inifileout << "#Output_height_pixels" << std::endl;
		inifileout << outputh << std::endl;
		inifileout << "#0=360Fisheye_1=180Fisheye_etc--see_transformtype.txt" << std::endl;
		inifileout << transformtype << std::endl;
		inifileout << "#Output_video_codec_fourcc__use_NULL_for_same_as_input--see_fourcc.txt" << std::endl;
		inifileout << outputfourccstr << std::endl;		
		inifileout << "#Path_to_Map_file_used_for_transformtype_4_&_5" << std::endl;
		inifileout << "EP_xyuv_1920.map" << std::endl;
		inifileout << "#Output_fps_-1=same_as_input__0=image_sequence" << std::endl;
		inifileout << outputfpsstr << std::endl;
		
	} catch (int) {
		std::cerr << "An error occured writing to ini file."<< std::endl ; 		
	}
}